

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binarymodelserialiser.cpp
# Opt level: O0

bool __thiscall BinaryModelSerialiser::loadModel(BinaryModelSerialiser *this,QIODevice *source)

{
  QIODevice *pQVar1;
  ulong uVar2;
  BinaryModelSerialiserPrivate *this_00;
  QDataStream local_50 [8];
  QDataStream reader;
  BinaryModelSerialiserPrivate *d;
  QIODevice *local_20;
  QIODevice *source_local;
  BinaryModelSerialiser *this_local;
  
  if (source == (QIODevice *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    local_20 = source;
    source_local = (QIODevice *)this;
    uVar2 = QIODevice::isOpen();
    pQVar1 = local_20;
    if ((uVar2 & 1) == 0) {
      QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                ((QFlags<QIODeviceBase::OpenModeFlag> *)((long)&d + 4),ReadOnly);
      uVar2 = (**(code **)(*(long *)pQVar1 + 0x68))(pQVar1,d._4_4_);
      if ((uVar2 & 1) == 0) {
        this_local._7_1_ = 0;
        goto LAB_00132789;
      }
    }
    uVar2 = QIODevice::isReadable();
    if ((uVar2 & 1) == 0) {
      this_local._7_1_ = 0;
    }
    else {
      this_00 = d_func(this);
      if ((this_00->super_AbstractModelSerialiserPrivate).m_model == (QAbstractItemModel *)0x0) {
        this_local._7_1_ = 0;
      }
      else {
        QDataStream::QDataStream(local_50,local_20);
        QDataStream::setVersion
                  (local_50,(this_00->super_AbstractModelSerialiserPrivate).m_streamVersion);
        this_local._7_1_ = BinaryModelSerialiserPrivate::readBinary(this_00,local_50);
        QDataStream::~QDataStream(local_50);
      }
    }
  }
LAB_00132789:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool BinaryModelSerialiser::loadModel(QIODevice *source)
{
    if (!source)
        return false;
    if (!source->isOpen()) {
        if (!source->open(QIODevice::ReadOnly))
            return false;
    }
    if (!source->isReadable())
        return false;
    Q_D(BinaryModelSerialiser);
    if (!d->m_model)
        return false;
    QDataStream reader(source);
    reader.setVersion(d->m_streamVersion);
    return d->readBinary(reader);
}